

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcSampleVariablesTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::SampleShadingMaskCase::iterate(SampleShadingMaskCase *this)

{
  string *sampler;
  string *psVar1;
  ChannelOrder *pCVar2;
  ChannelOrder CVar3;
  ChannelType CVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  TestLog *pTVar8;
  RenderContext *pRVar9;
  SampleShadingMaskCase *pSVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined4 uVar15;
  deUint32 dVar16;
  int iVar17;
  undefined4 extraout_var;
  ulong uVar18;
  TestError *pTVar19;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  code *pcVar24;
  uint uVar25;
  ulong uVar26;
  TestContext *this_00;
  vector<int,_std::allocator<int>_> data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  GLuint fbo;
  GLuint rbo;
  GLuint tex;
  GLint maxSamples;
  GLuint fboMs;
  PixelBufferAccess pixels;
  TextureLevel results;
  undefined1 local_2f8 [8];
  TextureFormat TStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  long local_2d8;
  undefined1 local_2d0 [8];
  pointer local_2c8;
  undefined1 local_2c0 [24];
  int local_2a8;
  allocator<char> local_29a;
  allocator<char> local_299;
  undefined1 local_298 [8];
  TextureFormat TStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  int local_26c;
  TestLog *local_268;
  string local_260;
  string *local_240;
  undefined4 local_238;
  undefined4 local_234;
  string local_230;
  value_type local_210;
  SampleShadingMaskCase *local_1f0;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  int local_1c0;
  pointer local_1b8;
  pointer pbStack_1b0;
  int local_1a8;
  float *local_1a0;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_158;
  undefined1 local_138 [40];
  TextureFormat *local_110;
  ShaderProgram local_108;
  
  pTVar8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar13);
  if ((this->m_glslVersion == GLSL_VERSION_310_ES) &&
     (bVar11 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_OES_sample_variables"), !bVar11)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar20 = "GL_OES_sample_variables";
LAB_00dd08bd:
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_NOT_SUPPORTED,pcVar20);
    return STOP;
  }
  uVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar11 = true;
  if (((uVar14 & 0x300) != 0x100) &&
     (bVar12 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_EXT_color_buffer_float"), !bVar12)) {
    bVar11 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_ARB_color_buffer_float");
  }
  if (this->m_internalFormat == 0x8814 && bVar11 == false) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar20 = "Internalformat rgba32f not supported";
    goto LAB_00dd08bd;
  }
  CVar3 = (this->m_texFormat).order;
  CVar4 = (this->m_texFormat).type;
  if ((CVar4 != HALF_FLOAT || CVar3 != RGBA) &&
      ((CVar3 != R && CVar3 != RG) && CVar3 != RGBA || CVar4 != FLOAT)) {
    if ((CVar4 == UNSIGNED_INT8) || (CVar4 == SIGNED_INT8)) {
      (**(code **)(lVar23 + 0x868))(0x9110,&local_26c);
      if (local_26c < this->m_samples) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar20 = "Test sample count greater than MAX_INTEGER_SAMPLES";
        goto LAB_00dd08bd;
      }
    }
    else {
      (**(code **)(lVar23 + 0x868))(0x8d57,&local_26c);
      if (local_26c < this->m_samples) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar20 = "Test sample count greater than MAX_SAMPLES";
        goto LAB_00dd08bd;
      }
    }
  }
  else {
    (**(code **)(lVar23 + 0x880))(0x9100,this->m_internalFormat,0x80a9,1,&local_26c);
    if (local_26c < this->m_samples) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar20 = "Test sample count greater than samples that the format supports";
      goto LAB_00dd08bd;
    }
  }
  local_268 = pTVar8;
  (**(code **)(lVar23 + 0x6f8))(1,&local_270);
  if (this->m_samples == 0) {
    uVar15 = 0xde1;
    (**(code **)(lVar23 + 0xb8))(0xde1,local_270);
    (**(code **)(lVar23 + 0x1380))(0xde1,1,this->m_internalFormat,0x10,0x10);
    uVar26 = (ulong)(this->m_texFormat).type;
    if ((uVar26 < 0x24) && ((0x848000000U >> (uVar26 & 0x3f) & 1) != 0)) {
      uVar15 = 0xde1;
      (**(code **)(lVar23 + 0x1360))(0xde1,0x2800,0x2600);
      (**(code **)(lVar23 + 0x1360))(0xde1,0x2801,0x2600);
    }
  }
  else {
    uVar15 = 0x9100;
    (**(code **)(lVar23 + 0xb8))(0x9100);
    (**(code **)(lVar23 + 0x1390))(0x9100,this->m_samples,this->m_internalFormat,0x10,0x10);
  }
  (**(code **)(lVar23 + 0x6d0))(1,&local_234);
  (**(code **)(lVar23 + 0x78))(0x8d40,local_234);
  (**(code **)(lVar23 + 0x6a0))(0x8d40,0x8ce0,uVar15,local_270,0);
  (**(code **)(lVar23 + 0x1a00))(0,0,0x10,0x10);
  CVar4 = (this->m_texFormat).type;
  local_238 = uVar15;
  if (CVar4 == UNSIGNED_INT8) {
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start._4_4_ = 1;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish._0_4_ = 0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish._4_4_ = 1;
    (**(code **)(lVar23 + 0x1b8))(0x1800,0);
  }
  else if (CVar4 == SIGNED_INT8) {
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start._4_4_ = 1;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish._0_4_ = 0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish._4_4_ = 1;
    (**(code **)(lVar23 + 0x1b0))(0x1800,0);
  }
  else {
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start._4_4_ = 0x3f800000;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish._0_4_ = 0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish._4_4_ = 0x3f800000;
    (**(code **)(lVar23 + 0x1a8))(0x1800,0);
  }
  pRVar9 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main()\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  sampler = &this->m_sampler;
  psVar1 = &this->m_outType;
  specializeVersion((string *)local_2f8,(string *)local_298,this->m_glslVersion,sampler,psVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,(char *)local_2f8,(allocator<char> *)&local_274);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "${VERSION_DECL}\n${OES_SV_RQ}layout(location = 0) out highp ${OUT_TYPE} o_color;\nuniform int u_sampleMask;\nvoid main()\n{\n    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n    }\n    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n}\n"
             ,"");
  specializeVersion(&local_230,&local_260,this->m_glslVersion,sampler,psVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,local_230._M_dataplus._M_p,(allocator<char> *)&local_278);
  local_138[0x10] = 0;
  local_138._17_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_2d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d0,&local_210);
  local_240 = psVar1;
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar9,(ProgramSources *)local_1e8);
  local_110 = &this->m_texFormat;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_158);
  lVar22 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + lVar22));
    lVar22 = lVar22 + -0x18;
  } while (lVar22 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  pTVar8 = local_268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != (undefined1  [8])local_2c0) {
    operator_delete((void *)local_2d0,local_2c0._0_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  local_2d8 = lVar23;
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  glu::operator<<(pTVar8,&local_108);
  if (local_108.m_program.m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
               ,0x169);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_2d8 + 0x1680))(local_108.m_program.m_program);
  pcVar24 = *(code **)(local_2d8 + 0x14f0);
  uVar15 = (**(code **)(local_2d8 + 0xb48))(local_108.m_program.m_program,"u_sampleMask");
  (*pcVar24)(uVar15,this->m_sampleMask);
  local_2f8 = (undefined1  [8])(local_2f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"a_position","");
  local_2d0._0_4_ = 1;
  local_2c8 = (pointer)(local_2c0 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_2f8,(char *)((long)local_2f8 + (long)TStack_2f0));
  lVar23 = local_2d8;
  local_2a8 = 0;
  local_1e8._0_4_ = local_2d0._0_4_;
  local_1e0._M_p = (pointer)&local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_2c8,
             (undefined1 *)((long)local_2c8->m_data + local_2c0._0_8_));
  local_1c0 = local_2a8;
  local_1b8 = (pointer)0x8;
  pbStack_1b0 = (pointer)0x400000002;
  local_1a8 = 0;
  local_1a0 = iterate::position;
  if (local_2c8 != (pointer)(local_2c0 + 8)) {
    operator_delete(local_2c8,local_2c0._8_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  local_2d0 = (undefined1  [8])&DAT_600000001;
  local_2c8 = (pointer)CONCAT44(local_2c8._4_4_,1);
  local_2c0._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_108.m_program.m_program,1,
            (VertexArrayBinding *)local_1e8,(PrimitiveList *)local_2d0,(DrawUtilCallback *)0x0);
  dVar16 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar16,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                  ,0x179);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&local_108);
  pcVar24 = *(code **)(lVar23 + 0x78);
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar24)(0x8d40,iVar13);
  (**(code **)(lVar23 + 0x440))(1,&local_234);
  iVar13 = this->m_samples << 4;
  if (this->m_samples == 0) {
    iVar13 = 0x10;
  }
  (**(code **)(lVar23 + 0x6e8))(1,&local_274);
  (**(code **)(lVar23 + 0xa0))(0x8d41,local_274);
  (**(code **)(lVar23 + 0x1238))(0x8d41,this->m_internalFormat,iVar13,0x10);
  (**(code **)(local_2d8 + 0x6d0))(1,&local_278);
  lVar23 = local_2d8;
  (**(code **)(local_2d8 + 0x78))(0x8d40,local_278);
  (**(code **)(lVar23 + 0x688))(0x8d40,0x8ce0,0x8d41,local_274);
  (**(code **)(lVar23 + 0x1a00))(0,0,iVar13,0x10);
  pRVar9 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main(void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  psVar1 = local_240;
  specializeVersion((string *)local_2f8,(string *)local_298,this->m_glslVersion,sampler,local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,(char *)local_2f8,&local_299);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "${VERSION_DECL}\nuniform highp ${SAMPLER} u_tex;\nuniform highp ${SAMPLER}MS u_texMS;\nuniform int u_samples;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main(void)\n{\n    if (u_samples > 0) {\n        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n        int sampleId = int(gl_FragCoord.x) % u_samples;\n        o_color = texelFetch(u_texMS, coord, sampleId);\n    } else {\n        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n       o_color = texelFetch(u_tex, coord, 0);\n    }\n}\n"
             ,"");
  specializeVersion(&local_230,&local_260,this->m_glslVersion,sampler,psVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,local_230._M_dataplus._M_p,&local_29a);
  local_138[0x10] = 0;
  local_138._17_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_2d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d0,&local_210);
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar9,(ProgramSources *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_158);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  pTVar8 = local_268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != (undefined1  [8])local_2c0) {
    operator_delete((void *)local_2d0,local_2c0._0_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  glu::operator<<(pTVar8,&local_108);
  if (local_108.m_program.m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
               ,0x1ae);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_2d8 + 0x1680))(local_108.m_program.m_program);
  pcVar24 = *(code **)(local_2d8 + 0x14f0);
  uVar15 = (**(code **)(local_2d8 + 0xb48))(local_108.m_program.m_program,"u_samples");
  (*pcVar24)(uVar15,this->m_samples);
  pcVar24 = *(code **)(local_2d8 + 0x14f0);
  bVar11 = this->m_samples < 1;
  if (bVar11) {
    uVar15 = (**(code **)(local_2d8 + 0xb48))(local_108.m_program.m_program,"u_tex");
    (*pcVar24)(uVar15,0);
    pcVar24 = *(code **)(local_2d8 + 0x14f0);
    uVar15 = (**(code **)(local_2d8 + 0xb48))(local_108.m_program.m_program,"u_texMS");
  }
  else {
    uVar15 = (**(code **)(local_2d8 + 0xb48))(local_108.m_program.m_program,"u_tex");
    (*pcVar24)(uVar15,1);
    pcVar24 = *(code **)(local_2d8 + 0x14f0);
    uVar15 = (**(code **)(local_2d8 + 0xb48))(local_108.m_program.m_program,"u_texMS");
  }
  (*pcVar24)(uVar15,bVar11);
  local_2f8 = (undefined1  [8])(local_2f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"a_position","");
  local_2d0._0_4_ = 1;
  local_2c8 = (pointer)(local_2c0 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_2f8,(pointer)((long)TStack_2f0 + (long)local_2f8));
  local_2a8 = 0;
  local_1e8._0_4_ = local_2d0._0_4_;
  local_1e0._M_p = (pointer)&local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_2c8,
             (undefined1 *)((long)local_2c8->m_data + local_2c0._0_8_));
  local_1c0 = local_2a8;
  local_1b8 = (pointer)0x8;
  pbStack_1b0 = (pointer)0x400000002;
  local_1a8 = 0;
  local_1a0 = iterate()::position;
  if (local_2c8 != (pointer)(local_2c0 + 8)) {
    operator_delete(local_2c8,local_2c0._8_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  local_2d0 = (undefined1  [8])&DAT_600000001;
  local_2c8 = (pointer)CONCAT44(local_2c8._4_4_,1);
  local_2c0._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_108.m_program.m_program,1,
            (VertexArrayBinding *)local_1e8,(PrimitiveList *)local_2d0,(DrawUtilCallback *)0x0);
  dVar16 = (**(code **)(local_2d8 + 0x800))();
  glu::checkError(dVar16,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                  ,0x1ca);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&local_108);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&local_108,local_110,iVar13,0x10,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1e8,(TextureLevel *)&local_108);
  lVar23 = local_2d8;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2d0,
             (long)((int)local_1e0._M_p * local_1e0._M_p._4_4_),(allocator_type *)local_2f8);
  if (local_1e8._4_4_ == UNSIGNED_INT8) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,
               (long)(local_1e0._M_p._4_4_ * (int)local_1e0._M_p * 4),(allocator_type *)local_298);
    (**(code **)(lVar23 + 0x1220))
              (0,0,(ulong)local_1e0._M_p & 0xffffffff,local_1e0._M_p._4_4_,0x8d99,0x1405,local_2f8);
    if (TStack_2f0 != (TextureFormat)local_2f8) {
      uVar14 = 4;
      uVar26 = 0;
      do {
        uVar25 = *(uint *)((long)local_2f8 + (ulong)(uVar14 - 3) * 4);
        uVar6 = *(uint *)((long)local_2f8 + (ulong)(uVar14 - 2) * 4);
        uVar7 = *(uint *)((long)local_2f8 + (ulong)(uVar14 - 1) * 4);
        lVar23 = (ulong)(uVar14 - 4 >> 2) * 0x10;
        *(float *)((long)local_2d0 + lVar23) = (float)*(uint *)((long)local_2f8 + uVar26 * 4);
        *(float *)((long)local_2d0 + lVar23 + 4) = (float)uVar25;
        *(float *)((long)local_2d0 + lVar23 + 8) = (float)uVar6;
        *(float *)((long)local_2d0 + lVar23 + 0xc) = (float)uVar7;
        uVar26 = (ulong)uVar14;
        uVar14 = uVar14 + 4;
      } while (uVar26 < (ulong)((long)TStack_2f0 - (long)local_2f8 >> 2));
    }
  }
  else {
    if (local_1e8._4_4_ != SIGNED_INT8) {
      glu::readPixels(((this->super_TestCase).m_context)->m_renderCtx,0,0,
                      (PixelBufferAccess *)local_1e8);
      goto LAB_00dd1703;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_2f8,
               (long)(local_1e0._M_p._4_4_ * (int)local_1e0._M_p * 4),(allocator_type *)local_298);
    (**(code **)(lVar23 + 0x1220))
              (0,0,(ulong)local_1e0._M_p & 0xffffffff,local_1e0._M_p._4_4_,0x8d99,0x1404,local_2f8);
    if (TStack_2f0 != (TextureFormat)local_2f8) {
      uVar14 = 4;
      uVar26 = 0;
      do {
        iVar13 = *(int *)((long)local_2f8 + (ulong)(uVar14 - 3) * 4);
        iVar17 = *(int *)((long)local_2f8 + (ulong)(uVar14 - 2) * 4);
        iVar5 = *(int *)((long)local_2f8 + (ulong)(uVar14 - 1) * 4);
        lVar23 = (ulong)(uVar14 - 4 >> 2) * 0x10;
        *(float *)((long)local_2d0 + lVar23) = (float)*(int *)((long)local_2f8 + uVar26 * 4);
        *(float *)((long)local_2d0 + lVar23 + 4) = (float)iVar13;
        *(float *)((long)local_2d0 + lVar23 + 8) = (float)iVar17;
        *(float *)((long)local_2d0 + lVar23 + 0xc) = (float)iVar5;
        uVar26 = (ulong)uVar14;
        uVar14 = uVar14 + 4;
      } while (uVar26 < (ulong)((long)TStack_2f0 - (long)local_2f8 >> 2));
    }
  }
  if ((TextureFormat)local_2f8 != (TextureFormat)0x0) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity - (long)local_2f8);
  }
LAB_00dd1703:
  bVar12 = true;
  bVar11 = true;
  iVar13 = 0;
  local_1f0 = this;
  do {
    local_240 = (string *)(ulong)(uint)(iVar13 << 4);
    iVar17 = 0;
    do {
      uVar14 = local_1f0->m_samples + (uint)(local_1f0->m_samples == 0);
      local_268 = (TestLog *)CONCAT44(local_268._4_4_,iVar17);
      if (0 < (int)uVar14) {
        iVar5 = (int)local_240;
        uVar26 = 0;
        bVar11 = bVar12;
LAB_00dd1761:
        local_2f8 = (undefined1  [8])0x0;
        TStack_2f0 = (TextureFormat)0x0;
        uVar25 = (uint)uVar26;
        if ((local_1e8._4_4_ == UNSIGNED_INT8) || (local_1e8._4_4_ == SIGNED_INT8)) {
          local_2f8 = *(undefined1 (*) [8])
                       ((long)local_2d0 + (long)(int)(uVar14 * iVar17 + iVar5 + uVar25) * 0x10);
          TStack_2f0 = ((TextureFormat *)
                       ((long)local_2d0 + (long)(int)(uVar14 * iVar17 + iVar5 + uVar25) * 0x10))[1];
        }
        else {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_298,(int)local_1e8,uVar14 * iVar17 + uVar25,
                     iVar13);
          local_2f8 = local_298;
          TStack_2f0 = TStack_290;
        }
        if ((local_1f0->m_samples != 0) &&
           (((uint)local_1f0->m_sampleMask >> (uVar25 & 0x1f) & 1) == 0)) {
          local_298._0_4_ = R;
          local_298._4_4_ = 0x3f800000;
          TStack_290.order = R;
          TStack_290.type = 0x3f800000;
          if (((float)local_2f8._0_4_ != 0.0) || (NAN((float)local_2f8._0_4_))) goto LAB_00dd1841;
          uVar18 = 0xffffffffffffffff;
          do {
            if (uVar18 == 2) goto LAB_00dd186b;
            lVar23 = uVar18 * 4;
            uVar21 = uVar18 + 1;
            pCVar2 = &TStack_290.order + uVar18;
          } while ((*(float *)(local_2f8 + lVar23 + 8) == (float)*pCVar2) &&
                  (uVar18 = uVar21, !NAN(*(float *)(local_2f8 + lVar23 + 8)) && !NAN((float)*pCVar2)
                  ));
          goto LAB_00dd1870;
        }
        local_298._0_4_ = 0x3f800000;
        local_298._4_4_ = SNORM_INT8;
        TStack_290.order = R;
        TStack_290.type = 0x3f800000;
        if (((float)local_2f8._0_4_ == 1.0) && (!NAN((float)local_2f8._0_4_))) {
          uVar18 = 0xffffffffffffffff;
          do {
            if (uVar18 == 2) goto LAB_00dd186b;
            lVar23 = uVar18 * 4;
            uVar21 = uVar18 + 1;
            pCVar2 = &TStack_290.order + uVar18;
          } while ((*(float *)(local_2f8 + lVar23 + 8) == (float)*pCVar2) &&
                  (uVar18 = uVar21, !NAN(*(float *)(local_2f8 + lVar23 + 8)) && !NAN((float)*pCVar2)
                  ));
          goto LAB_00dd1870;
        }
LAB_00dd1841:
        bVar11 = false;
        goto LAB_00dd1881;
      }
LAB_00dd188d:
      pSVar10 = local_1f0;
      lVar23 = local_2d8;
      iVar17 = (int)local_268 + 1;
    } while (iVar17 != 0x10);
    iVar13 = iVar13 + 1;
    if (iVar13 == 0x10) {
      pcVar24 = *(code **)(local_2d8 + 0x78);
      iVar13 = (*((local_1f0->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
      (*pcVar24)(0x8d40,iVar13);
      (**(code **)(lVar23 + 0x440))(1,&local_278);
      (**(code **)(lVar23 + 0xa0))(0x8d41,0);
      (**(code **)(lVar23 + 0x460))(1,&local_274);
      (**(code **)(lVar23 + 0xb8))(local_238,0);
      (**(code **)(lVar23 + 0x480))(1,&local_270);
      pcVar20 = "Fail";
      if (bVar11) {
        pcVar20 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((pSVar10->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(byte)~bVar11,pcVar20);
      if (local_2d0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2d0,local_2c0._0_8_ - (long)local_2d0);
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_108);
      return STOP;
    }
  } while( true );
LAB_00dd186b:
  uVar21 = 3;
LAB_00dd1870:
  if (uVar21 < 3) {
    bVar11 = false;
  }
LAB_00dd1881:
  TStack_290.order = R;
  TStack_290.type = 0x3f800000;
  uVar26 = uVar26 + 1;
  bVar12 = bVar11;
  if (uVar26 == uVar14) goto LAB_00dd188d;
  goto LAB_00dd1761;
}

Assistant:

SampleShadingMaskCase::IterateResult SampleShadingMaskCase::iterate()
{
	TestLog&			  log			  = m_testCtx.getLog();
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	bool				  isOk			  = true;
	bool				  supportsRgba32f = false;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_variables");
		return STOP;
	}

	supportsRgba32f = isContextTypeGLCore(m_context.getRenderContext().getType()) ?
						  true :
						  (m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float") ||
						   m_context.getContextInfo().isExtensionSupported("GL_ARB_color_buffer_float"));

	if (m_internalFormat == GL_RGBA32F && !supportsRgba32f)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Internalformat rgba32f not supported");
		return STOP;
	}

	GLint maxSamples;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED,
									"Test sample count greater than samples that the format supports");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_INTEGER_SAMPLES");
			return STOP;
		}
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_SAMPLES");
			return STOP;
		}
	}

	// Create a multisample texture, or a regular texture if samples is zero.
	GLuint tex;
	gl.genTextures(1, &tex);
	GLenum target;
	if (m_samples)
	{
		target = GL_TEXTURE_2D_MULTISAMPLE;
		gl.bindTexture(target, tex);
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);
	}
	else
	{
		target = GL_TEXTURE_2D;
		gl.bindTexture(target, tex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_internalFormat, WIDTH, HEIGHT);
		if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8 || m_texFormat.type == tcu::TextureFormat::FLOAT)
		{
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
	}

	// Create a framebuffer with the texture attached and clear to "green".
	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);
	if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8)
	{
		GLint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferiv(GL_COLOR, 0, color);
	}
	else if (m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		GLuint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferuiv(GL_COLOR, 0, color);
	}
	else
	{
		GLfloat color[4] = { 0.0f, 1.0f, 0.0f, 1.0f };
		gl.clearBufferfv(GL_COLOR, 0, color);
	}

	static deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		// Draw a quad setting all samples to "red". We only expect "red"
		// to be written if the sample mask bit for that sample is 1.

		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main()\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_RQ}"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "uniform int u_sampleMask;\n"
								 "void main()\n"
								 "{\n"
								 "    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampleMask"), m_sampleMask);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * ((m_samples) ? m_samples : 1);

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		// Resolve the multi-sample texture into a render-buffer sized such that
		// the width can hold all samples of a pixel.
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform highp ${SAMPLER}MS u_texMS;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "    if (u_samples > 0) {\n"
								 "        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "        int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "        o_color = texelFetch(u_texMS, coord, sampleId);\n"
								 "    } else {\n"
								 "        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n"
								 "       o_color = texelFetch(u_tex, coord, 0);\n"
								 "    }\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), m_samples);
		if (m_samples > 0)
		{
			// only MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 1);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 0);
		}
		else
		{
			// only non-MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 1);
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
	}

	for (int y = 0; y < HEIGHT; ++y)
	{
		for (int x = 0; x < WIDTH; ++x)
		{
			GLint samples = (m_samples) ? m_samples : 1;
			for (int sample = 0; sample < samples; ++sample)
			{
				tcu::Vec4 pixel;
				if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8 ||
					pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
				{
					pixel = result[y * WIDTH + x * samples + sample];
				}
				else
				{
					pixel = pixels.getPixel(x * samples + sample, y);
				}

				// Make sure only those samples where the sample mask bit is
				// non-zero have the "red" pixel values.
				if (!m_samples || (m_sampleMask & (1 << sample)))
				{
					if (pixel != tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
				else
				{
					if (pixel != tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(target, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}